

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O1

void __thiscall bandit::detail::bandit_context::~bandit_context(bandit_context *this)

{
  pointer pcVar1;
  
  (this->super_context)._vptr_context = (_func_int **)&PTR__bandit_context_0011da90;
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->after_eaches_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->before_eaches_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  pcVar1 = (this->desc_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->desc_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

bandit_context(const char* desc, bool hard_skip_a)
          : desc_(desc), hard_skip_(hard_skip_a), is_executing_(false)
        {}